

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReader.h
# Opt level: O0

uint64_t __thiscall FileReader::size(FileReader *this)

{
  bool bVar1;
  int iVar2;
  posixerror *ppVar3;
  undefined8 *puVar4;
  allocator<char> local_111;
  string local_110;
  FileReader *local_f0;
  uint64_t devsize;
  allocator<char> local_d1;
  string local_d0;
  undefined1 local_b0 [8];
  stat data;
  int h;
  FileReader *this_local;
  
  bVar1 = ReadWriter::isreadonly(&this->super_ReadWriter);
  if (!bVar1) {
    flush(this);
  }
  data.__glibc_reserved[2]._4_4_ = fileno((FILE *)this->_f);
  iVar2 = fstat(data.__glibc_reserved[2]._4_4_,(stat *)local_b0);
  if (iVar2 == -1) {
    devsize._3_1_ = 1;
    ppVar3 = (posixerror *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"fstat",&local_d1);
    posixerror::posixerror(ppVar3,&local_d0);
    devsize._3_1_ = 0;
    __cxa_throw(ppVar3,&posixerror::typeinfo,posixerror::~posixerror);
  }
  if (((uint)data.st_nlink & 0xf000) == 0x8000) {
    this_local = (FileReader *)data.st_rdev;
  }
  else {
    if (((uint)data.st_nlink & 0xf000) != 0x6000) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = "not a file or blockdev";
      __cxa_throw(puVar4,&char_const*::typeinfo,0);
    }
    iVar2 = ioctl(data.__glibc_reserved[2]._4_4_,0x80081272,&local_f0);
    if (iVar2 == -1) {
      ppVar3 = (posixerror *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,"ioctl(BLKGETSIZE64)",&local_111);
      posixerror::posixerror(ppVar3,&local_110);
      __cxa_throw(ppVar3,&posixerror::typeinfo,posixerror::~posixerror);
    }
    this_local = local_f0;
  }
  return (uint64_t)this_local;
}

Assistant:

virtual uint64_t size()
    {
#ifdef _WIN32_WCE
        throw "file::size not supported under wince";
        flush();

        DWORD fsHigh;
        DWORD fsLow= GetFileSize(fileno(_f), &fsHigh);
        if (fsLow==0xFFFFFFFF && GetLastError())
            throw win32error("GetFileSize");
        return (uint64_t(fsHigh)<<32) | fsLow;
#else
        // if we don't fflush, there may be unwritten bytes in the file buffer
        // which are not counted in the size yet
        if (!isreadonly())
            flush();

        int h= fileno(_f);
        struct stat data;
        if (-1==fstat(h, &data))
            throw posixerror("fstat");
        if (S_ISREG(data.st_mode)) {
            return data.st_size;
        }
#if !defined(_WIN32) && !defined(__FreeBSD__)
        else if (S_ISBLK(data.st_mode)) {
#if TARGET_OS_IPHONE
            throw "block devices not supported on IOS";
#elif defined(__MACH__)
            uint64_t bkcount;
            uint32_t bksize;
            if (-1==ioctl(h, DKIOCGETBLOCKCOUNT, &bkcount))
                throw posixerror("ioctl(DKIOCGETBLOCKCOUNT)");
            if (-1==ioctl(h, DKIOCGETBLOCKSIZE, &bksize))
                throw posixerror("ioctl(DKIOCGETBLOCKSIZE)");
            return bkcount*bksize;
#else
            uint64_t devsize;
            if (-1==ioctl(h, BLKGETSIZE64, &devsize))
                throw posixerror("ioctl(BLKGETSIZE64)");
            return devsize;
#endif
        }
#endif
        else {
            throw "not a file or blockdev";
        }
#endif
    }